

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O2

uint8_t * __thiscall
aeron::util::MemoryMappedFile::doMapping
          (MemoryMappedFile *this,size_t length,FileHandle fd,size_t offset)

{
  uint8_t *puVar1;
  IOException *this_00;
  char *pcVar2;
  allocator local_7b;
  allocator local_7a;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  puVar1 = (uint8_t *)mmap64((void *)0x0,length,3,1,fd.handle,offset);
  if (puVar1 != (uint8_t *)0xffffffffffffffff) {
    return puVar1;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string((string *)&local_38,"failed to Memory Map File",&local_79);
  std::__cxx11::string::string
            ((string *)&local_58,
             "uint8_t *aeron::util::MemoryMappedFile::doMapping(size_t, FileHandle, size_t)",
             &local_7a);
  pcVar2 = past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/util/MemoryMappedFile.cpp"
                      );
  std::__cxx11::string::string((string *)&local_78,pcVar2,&local_7b);
  IOException::IOException(this_00,&local_38,&local_58,&local_78,0x120);
  __cxa_throw(this_00,&IOException::typeinfo,SourcedException::~SourcedException);
}

Assistant:

uint8_t* MemoryMappedFile::doMapping(size_t length, FileHandle fd, size_t offset)
{
    void* memory = ::mmap(NULL, length, PROT_READ|PROT_WRITE, MAP_SHARED, fd.handle, static_cast<off_t>(offset));

    if (MAP_FAILED == memory)
    {
        throw IOException("failed to Memory Map File", SOURCEINFO);
    }

    return static_cast<uint8_t*>(memory);
}